

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtz.cpp
# Opt level: O1

void __thiscall
vmtz_rule::set(vmtz_rule *this,os_tzrule_t *desc,char *abbr,int32_t gmtofs,int32_t save)

{
  int32_t dayno;
  caldate_t cd;
  caldate_t local_1c;
  
  this->fmt = abbr;
  this->gmtofs = gmtofs;
  this->save = save;
  this->at = desc->time * 1000;
  this->at_zone = '\0';
  local_1c.d = desc->jday;
  if (local_1c.d == 0) {
    if (desc->yday == 0) {
      if (desc->month == 0) {
        return;
      }
      this->mm = (char)desc->month;
      this->weekday = (char)desc->day;
      if (desc->week == 5) {
        this->when = '\x01';
        return;
      }
      this->when = '\x02';
      this->dd = (char)((char)desc->week + -1) * 7 + 1;
      return;
    }
    this->mm = '\x01';
    this->when = '\0';
    local_1c.d._0_2_ = (short)desc->yday;
  }
  else {
    local_1c.y = 0x7db;
    local_1c.m = 1;
    dayno = caldate_t::dayno(&local_1c);
    caldate_t::set_dayno(&local_1c,dayno);
    this->when = '\0';
    this->mm = (char)local_1c.m;
  }
  this->dd = (short)local_1c.d;
  return;
}

Assistant:

void vmtz_rule::set(const os_tzrule_t *desc, const char *abbr,
                    int32_t gmtofs, int32_t save)
{
    /* set the basic description */
    this->fmt = abbr;
    this->gmtofs = gmtofs;
    this->save = save;

    /* the OS description always uses local wall clock time */
    this->at = desc->time * 1000;
    this->at_zone = 0;

    /* transcode the date to our format */
    if (desc->jday != 0)
    {
        /* 
         *   "Jn" = nth day of the year, NOT counting Feb 29.  Since the date
         *   mapping is the same for leap years and non-leap years, this is
         *   just an obtuse way of specifying a month and day.  So, figure
         *   the mm/dd date that the Jn date represents, and map it to our
         *   mode 0 (day <dd> of <month>).  We can figure the month/day by
         *   setting up a calendar with "January N" in any non-leap year -
         *   since it's a non-leap year, it won't have a Feb 29, so we'll get
         *   the right mapping for dates after J59.
         */
        caldate_t cd(2011, 1, desc->jday);
        cd.normalize_date();
        this->when = 0;
        this->mm = (char)cd.m;
        this->dd = (short)cd.d;
    }
    else if (desc->yday != 0)
    {
        /* 
         *   "n" = nth day of the year, counting Feb 29.  We can encode this
         *   as "January n", even if n > 31, since our calendar calculator
         *   handle overflows in the day of the month by carrying them into
         *   subsequent months. 
         */
        this->when = 0;
        this->mm = 1;
        this->dd = (short)desc->yday;
    }
    else if (desc->month != 0)
    {
        /* Month/week/day spec */
        this->mm = (char)desc->month;
        this->weekday = (char)desc->day;
        if (desc->week == 5)
        {
            /* week 5 means "last <weekday>", which is our mode 1 */
            this->when = 1;
        }
        else
        {
            /* 
             *   week 1-4 means "nth <weekday>"; we can encode this as mode
             *   2, "weekday>=n", where n is 1 for the first week, 8 for the
             *   second week, 15 for the third week, 22 for the fourth week
             */
            this->when = 2;
            this->dd = (char)(desc->week - 1)*7 + 1;
        }
    }
}